

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.c
# Opt level: O0

void DrawTexturePro(Texture2D texture,Rectangle source,Rectangle dest,Vector2 origin,float rotation,
                   Color tint)

{
  bool bVar1;
  undefined8 uVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float dy;
  float dx;
  float y_1;
  float x_1;
  float cosRotation;
  float sinRotation;
  float y;
  float x;
  Vector2 bottomRight;
  Vector2 bottomLeft;
  Vector2 topRight;
  Vector2 topLeft;
  _Bool flipX;
  float height;
  float width;
  float rotation_local;
  Color tint_local;
  Vector2 origin_local;
  Rectangle dest_local;
  Rectangle source_local;
  
  dest_local._8_8_ = source._0_8_;
  if (texture.id != 0) {
    fVar3 = (float)texture.width;
    fVar4 = (float)texture.height;
    source_local.x = source.width;
    bVar1 = source_local.x < 0.0;
    uVar2 = source._8_8_;
    if (bVar1) {
      source_local.y = source.height;
      source_local.x = source_local.x * -1.0;
      uVar2 = source_local._0_8_;
    }
    source_local._0_8_ = uVar2;
    if (source_local.y < 0.0) {
      dest_local.height = source.y;
      dest_local.width = source.x;
      dest_local.height = dest_local.height - source_local.y;
    }
    memset(&topRight,0,8);
    memset(&bottomLeft,0,8);
    memset(&bottomRight,0,8);
    memset(&y,0,8);
    origin_local.x = dest.x;
    origin_local.y = dest.y;
    rotation_local = origin.x;
    tint_local = (Color)origin.y;
    dest_local.x = dest.width;
    dest_local.y = dest.height;
    if ((rotation != 0.0) || (NAN(rotation))) {
      fVar7 = sinf(rotation * 0.017453292);
      fVar8 = cosf(rotation * 0.017453292);
      fVar5 = -rotation_local;
      fVar6 = -(float)tint_local;
      topRight.y = fVar6 * fVar8 + fVar5 * fVar7 + origin_local.y;
      topRight.x = -fVar6 * fVar7 + fVar5 * fVar8 + origin_local.x;
      bottomLeft.y = fVar6 * fVar8 + (fVar5 + dest_local.x) * fVar7 + origin_local.y;
      bottomLeft.x = -fVar6 * fVar7 + (fVar5 + dest_local.x) * fVar8 + origin_local.x;
      bottomRight.y = (fVar6 + dest_local.y) * fVar8 + fVar5 * fVar7 + origin_local.y;
      bottomRight.x = -(fVar6 + dest_local.y) * fVar7 + fVar5 * fVar8 + origin_local.x;
      _y = CONCAT44((fVar6 + dest_local.y) * fVar8 + (fVar5 + dest_local.x) * fVar7 + origin_local.y
                    ,-(fVar6 + dest_local.y) * fVar7 +
                     (fVar5 + dest_local.x) * fVar8 + origin_local.x);
    }
    else {
      fVar5 = origin_local.x - rotation_local;
      fVar6 = origin_local.y - (float)tint_local;
      topRight.y = fVar6;
      topRight.x = fVar5;
      bottomLeft.y = fVar6;
      bottomLeft.x = fVar5 + dest_local.x;
      bottomRight.y = fVar6 + dest_local.y;
      bottomRight.x = fVar5;
      _y = CONCAT44(fVar6 + dest_local.y,fVar5 + dest_local.x);
    }
    rlCheckRenderBatchLimit(4);
    rlSetTexture(texture.id);
    rlBegin(7);
    width._0_1_ = tint.r;
    width._1_1_ = tint.g;
    width._2_1_ = tint.b;
    width._3_1_ = tint.a;
    rlColor4ub(width._0_1_,width._1_1_,width._2_1_,width._3_1_);
    rlNormal3f(0.0,0.0,1.0);
    if (bVar1) {
      rlTexCoord2f((dest_local.width + source_local.x) / fVar3,dest_local.height / fVar4);
    }
    else {
      rlTexCoord2f(dest_local.width / fVar3,dest_local.height / fVar4);
    }
    rlVertex2f(topRight.x,topRight.y);
    if (bVar1) {
      rlTexCoord2f((dest_local.width + source_local.x) / fVar3,
                   (dest_local.height + source_local.y) / fVar4);
    }
    else {
      rlTexCoord2f(dest_local.width / fVar3,(dest_local.height + source_local.y) / fVar4);
    }
    rlVertex2f(bottomRight.x,bottomRight.y);
    if (bVar1) {
      rlTexCoord2f(dest_local.width / fVar3,(dest_local.height + source_local.y) / fVar4);
    }
    else {
      rlTexCoord2f((dest_local.width + source_local.x) / fVar3,
                   (dest_local.height + source_local.y) / fVar4);
    }
    rlVertex2f(y,x);
    if (bVar1) {
      rlTexCoord2f(dest_local.width / fVar3,dest_local.height / fVar4);
    }
    else {
      rlTexCoord2f((dest_local.width + source_local.x) / fVar3,dest_local.height / fVar4);
    }
    rlVertex2f(bottomLeft.x,bottomLeft.y);
    rlEnd();
    rlSetTexture(0);
  }
  return;
}

Assistant:

void DrawTexturePro(Texture2D texture, Rectangle source, Rectangle dest, Vector2 origin, float rotation, Color tint)
{
    // Check if texture is valid
    if (texture.id > 0)
    {
        float width = (float)texture.width;
        float height = (float)texture.height;

        bool flipX = false;

        if (source.width < 0) { flipX = true; source.width *= -1; }
        if (source.height < 0) source.y -= source.height;

        Vector2 topLeft = { 0 };
        Vector2 topRight = { 0 };
        Vector2 bottomLeft = { 0 };
        Vector2 bottomRight = { 0 };

        // Only calculate rotation if needed
        if (rotation == 0.0f)
        {
            float x = dest.x - origin.x;
            float y = dest.y - origin.y;
            topLeft = (Vector2){ x, y };
            topRight = (Vector2){ x + dest.width, y };
            bottomLeft = (Vector2){ x, y + dest.height };
            bottomRight = (Vector2){ x + dest.width, y + dest.height };
        }
        else
        {
            float sinRotation = sinf(rotation*DEG2RAD);
            float cosRotation = cosf(rotation*DEG2RAD);
            float x = dest.x;
            float y = dest.y;
            float dx = -origin.x;
            float dy = -origin.y;

            topLeft.x = x + dx*cosRotation - dy*sinRotation;
            topLeft.y = y + dx*sinRotation + dy*cosRotation;

            topRight.x = x + (dx + dest.width)*cosRotation - dy*sinRotation;
            topRight.y = y + (dx + dest.width)*sinRotation + dy*cosRotation;

            bottomLeft.x = x + dx*cosRotation - (dy + dest.height)*sinRotation;
            bottomLeft.y = y + dx*sinRotation + (dy + dest.height)*cosRotation;

            bottomRight.x = x + (dx + dest.width)*cosRotation - (dy + dest.height)*sinRotation;
            bottomRight.y = y + (dx + dest.width)*sinRotation + (dy + dest.height)*cosRotation;
        }

        rlCheckRenderBatchLimit(4);     // Make sure there is enough free space on the batch buffer

        rlSetTexture(texture.id);
        rlBegin(RL_QUADS);

            rlColor4ub(tint.r, tint.g, tint.b, tint.a);
            rlNormal3f(0.0f, 0.0f, 1.0f);                          // Normal vector pointing towards viewer

            // Top-left corner for texture and quad
            if (flipX) rlTexCoord2f((source.x + source.width)/width, source.y/height);
            else rlTexCoord2f(source.x/width, source.y/height);
            rlVertex2f(topLeft.x, topLeft.y);

            // Bottom-left corner for texture and quad
            if (flipX) rlTexCoord2f((source.x + source.width)/width, (source.y + source.height)/height);
            else rlTexCoord2f(source.x/width, (source.y + source.height)/height);
            rlVertex2f(bottomLeft.x, bottomLeft.y);

            // Bottom-right corner for texture and quad
            if (flipX) rlTexCoord2f(source.x/width, (source.y + source.height)/height);
            else rlTexCoord2f((source.x + source.width)/width, (source.y + source.height)/height);
            rlVertex2f(bottomRight.x, bottomRight.y);

            // Top-right corner for texture and quad
            if (flipX) rlTexCoord2f(source.x/width, source.y/height);
            else rlTexCoord2f((source.x + source.width)/width, source.y/height);
            rlVertex2f(topRight.x, topRight.y);

        rlEnd();
        rlSetTexture(0);

        // NOTE: Vertex position can be transformed using matrices
        // but the process is way more costly than just calculating
        // the vertex positions manually, like done above.
        // I leave here the old implementation for educational pourposes,
        // just in case someone wants to do some performance test
        /*
        rlSetTexture(texture.id);
        rlPushMatrix();
            rlTranslatef(dest.x, dest.y, 0.0f);
            if (rotation != 0.0f) rlRotatef(rotation, 0.0f, 0.0f, 1.0f);
            rlTranslatef(-origin.x, -origin.y, 0.0f);

            rlBegin(RL_QUADS);
                rlColor4ub(tint.r, tint.g, tint.b, tint.a);
                rlNormal3f(0.0f, 0.0f, 1.0f);                          // Normal vector pointing towards viewer

                // Bottom-left corner for texture and quad
                if (flipX) rlTexCoord2f((source.x + source.width)/width, source.y/height);
                else rlTexCoord2f(source.x/width, source.y/height);
                rlVertex2f(0.0f, 0.0f);

                // Bottom-right corner for texture and quad
                if (flipX) rlTexCoord2f((source.x + source.width)/width, (source.y + source.height)/height);
                else rlTexCoord2f(source.x/width, (source.y + source.height)/height);
                rlVertex2f(0.0f, dest.height);

                // Top-right corner for texture and quad
                if (flipX) rlTexCoord2f(source.x/width, (source.y + source.height)/height);
                else rlTexCoord2f((source.x + source.width)/width, (source.y + source.height)/height);
                rlVertex2f(dest.width, dest.height);

                // Top-left corner for texture and quad
                if (flipX) rlTexCoord2f(source.x/width, source.y/height);
                else rlTexCoord2f((source.x + source.width)/width, source.y/height);
                rlVertex2f(dest.width, 0.0f);
            rlEnd();
        rlPopMatrix();
        rlSetTexture(0);
        */
    }
}